

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

void rehash(st_table *table)

{
  uint uVar1;
  ulong uVar2;
  st_table_entry **__ptr;
  st_table_entry *psVar3;
  ulong uVar4;
  st_table_entry *psVar5;
  long lVar6;
  st_table_entry **ppsVar7;
  ulong uVar8;
  int newsize;
  int iVar9;
  uint uVar10;
  
  uVar1 = table->num_bins;
  iVar9 = 8;
  lVar6 = 0;
  while (iVar9 <= (int)(uVar1 + 1)) {
    iVar9 = iVar9 * 2;
    lVar6 = lVar6 + 8;
    if ((int)lVar6 == 0xe8) {
      return;
    }
  }
  uVar2 = *(ulong *)((long)primes + lVar6);
  uVar10 = (uint)uVar2;
  if ((int)uVar10 < 1) {
    return;
  }
  ppsVar7 = (st_table_entry **)calloc((ulong)(uVar10 & 0x7fffffff),8);
  if (ppsVar7 == (st_table_entry **)0x0) {
    return;
  }
  __ptr = table->bins;
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      psVar5 = __ptr[uVar8];
      while (psVar5 != (st_table_entry *)0x0) {
        psVar3 = psVar5->next;
        uVar4 = (ulong)psVar5->hash % (uVar2 & 0xffffffff);
        psVar5->next = ppsVar7[uVar4];
        ppsVar7[uVar4] = psVar5;
        psVar5 = psVar3;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  free(__ptr);
  table->num_bins = uVar10;
  table->bins = ppsVar7;
  return;
}

Assistant:

static void
rehash(register st_table* table)
{
  register st_table_entry *ptr, *next, **new_bins;
  int i, new_num_bins, old_num_bins;
  unsigned int hash_val;

  old_num_bins = table->num_bins;
  new_num_bins = new_size(old_num_bins + 1);
  if (new_num_bins <= 0) return ;

  new_bins = (st_table_entry**)Calloc(new_num_bins, sizeof(st_table_entry*));
  if (new_bins == 0) {
    return ;
  }

  for(i = 0; i < old_num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    hash_val = ptr->hash % new_num_bins;
	    ptr->next = new_bins[hash_val];
	    new_bins[hash_val] = ptr;
	    ptr = next;
    }
  }
  free(table->bins);
  table->num_bins = new_num_bins;
  table->bins = new_bins;
}